

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

bool __thiscall
cmStateDirectory::ContainsBoth(cmStateDirectory *this,string *param_1,string *remote_path)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  bool local_59;
  bool local_41;
  bool local_24;
  anon_class_1_0_00000001 local_21;
  bool bothInSource;
  bool bothInBinary;
  string *psStack_20;
  anon_class_1_0_00000001 PathEqOrSubDir;
  string *remote_path_local;
  string *local_path_local;
  cmStateDirectory *this_local;
  
  psStack_20 = remote_path;
  psVar2 = GetRelativePathTopBinary_abi_cxx11_(this);
  bVar1 = ContainsBoth::anon_class_1_0_00000001::operator()(&local_21,param_1,psVar2);
  psVar2 = psStack_20;
  local_24 = false;
  if (bVar1) {
    psVar3 = GetRelativePathTopBinary_abi_cxx11_(this);
    local_24 = ContainsBoth::anon_class_1_0_00000001::operator()(&local_21,psVar2,psVar3);
  }
  psVar2 = GetRelativePathTopSource_abi_cxx11_(this);
  bVar1 = ContainsBoth::anon_class_1_0_00000001::operator()(&local_21,param_1,psVar2);
  psVar2 = psStack_20;
  local_41 = false;
  if (bVar1) {
    psVar3 = GetRelativePathTopSource_abi_cxx11_(this);
    local_41 = ContainsBoth::anon_class_1_0_00000001::operator()(&local_21,psVar2,psVar3);
  }
  local_59 = true;
  if (local_24 == false) {
    local_59 = local_41;
  }
  return local_59;
}

Assistant:

bool cmStateDirectory::ContainsBoth(std::string const& local_path,
                                    std::string const& remote_path) const
{
  auto PathEqOrSubDir = [](std::string const& a, std::string const& b) {
    return (cmSystemTools::ComparePath(a, b) ||
            cmSystemTools::IsSubDirectory(a, b));
  };

  bool bothInBinary = PathEqOrSubDir(local_path, GetRelativePathTopBinary()) &&
    PathEqOrSubDir(remote_path, GetRelativePathTopBinary());

  bool bothInSource = PathEqOrSubDir(local_path, GetRelativePathTopSource()) &&
    PathEqOrSubDir(remote_path, GetRelativePathTopSource());

  return bothInBinary || bothInSource;
}